

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float>::gemm<2,1>
          (tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  long lVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  __m128i x;
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  float local_a0 [28];
  
  lVar16 = n - n0;
  lVar17 = ((m - m0) / 2) * lVar16;
  lVar10 = (lVar17 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  lVar12 = *(int *)(this + 0x38) * lVar10;
  lVar10 = lVar10 + lVar12;
  if (lVar17 <= lVar10) {
    lVar10 = lVar17;
  }
  if (lVar12 < lVar10) {
    lVar17 = *(long *)(this + 0x28);
    auVar18[8] = 0xf;
    auVar18._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar18[9] = 0xf;
    auVar18[10] = 0xf;
    auVar18[0xb] = 0xf;
    auVar18[0xc] = 0xf;
    auVar18[0xd] = 0xf;
    auVar18[0xe] = 0xf;
    auVar18[0xf] = 0xf;
    auVar18[0x10] = 0xf;
    auVar18[0x11] = 0xf;
    auVar18[0x12] = 0xf;
    auVar18[0x13] = 0xf;
    auVar18[0x14] = 0xf;
    auVar18[0x15] = 0xf;
    auVar18[0x16] = 0xf;
    auVar18[0x17] = 0xf;
    auVar18[0x18] = 0xf;
    auVar18[0x19] = 0xf;
    auVar18[0x1a] = 0xf;
    auVar18[0x1b] = 0xf;
    auVar18[0x1c] = 0xf;
    auVar18[0x1d] = 0xf;
    auVar18[0x1e] = 0xf;
    auVar18[0x1f] = 0xf;
    auVar19[8] = 0xf8;
    auVar19._0_8_ = 0xf8f8f8f8f8f8f8f8;
    auVar19[9] = 0xf8;
    auVar19[10] = 0xf8;
    auVar19[0xb] = 0xf8;
    auVar19[0xc] = 0xf8;
    auVar19[0xd] = 0xf8;
    auVar19[0xe] = 0xf8;
    auVar19[0xf] = 0xf8;
    auVar19[0x10] = 0xf8;
    auVar19[0x11] = 0xf8;
    auVar19[0x12] = 0xf8;
    auVar19[0x13] = 0xf8;
    auVar19[0x14] = 0xf8;
    auVar19[0x15] = 0xf8;
    auVar19[0x16] = 0xf8;
    auVar19[0x17] = 0xf8;
    auVar19[0x18] = 0xf8;
    auVar19[0x19] = 0xf8;
    auVar19[0x1a] = 0xf8;
    auVar19[0x1b] = 0xf8;
    auVar19[0x1c] = 0xf8;
    auVar19[0x1d] = 0xf8;
    auVar19[0x1e] = 0xf8;
    auVar19[0x1f] = 0xf8;
    lVar3 = *(long *)(this + 8);
    lVar4 = *(long *)(this + 0x10);
    lVar5 = *(long *)(this + 0x18);
    lVar6 = *(long *)this;
    lVar7 = *(long *)(this + 0x20);
    lVar8 = *(long *)(this + 0x30);
    do {
      local_a0[8] = 0.0;
      local_a0[9] = 0.0;
      local_a0[10] = 0.0;
      local_a0[0xb] = 0.0;
      local_a0[0xc] = 0.0;
      local_a0[0xd] = 0.0;
      local_a0[0xe] = 0.0;
      local_a0[0xf] = 0.0;
      local_a0[0] = 0.0;
      local_a0[1] = 0.0;
      local_a0[2] = 0.0;
      local_a0[3] = 0.0;
      local_a0[4] = 0.0;
      local_a0[5] = 0.0;
      local_a0[6] = 0.0;
      local_a0[7] = 0.0;
      lVar13 = lVar12 % lVar16 + n0;
      lVar1 = m0 + (lVar12 / lVar16) * 2;
      if (0 < lVar5) {
        auVar2 = *(undefined1 (*) [16])(lVar6 + 2 + lVar1 * lVar7 * 0x12);
        auVar22 = vpsrlw_avx(auVar2,4);
        auVar21._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar2;
        auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
        auVar18 = vpand_avx2(auVar21,auVar18);
        auVar18 = vpaddb_avx2(auVar18,auVar19);
        vpsignb_avx2(auVar18,auVar18);
        vpsignb_avx2(*(undefined1 (*) [32])(lVar17 * lVar13 * 0x22 + lVar3 + 2),auVar18);
        halt_baddata();
      }
      lVar14 = 0;
      pfVar15 = local_a0 + 8;
      bVar9 = true;
      do {
        bVar11 = bVar9;
        auVar22._0_4_ = pfVar15[4] + *pfVar15;
        auVar22._4_4_ = pfVar15[5] + pfVar15[1];
        auVar22._8_4_ = pfVar15[6] + pfVar15[2];
        auVar22._12_4_ = pfVar15[7] + pfVar15[3];
        auVar2 = vshufpd_avx(auVar22,auVar22,1);
        auVar20._0_4_ = auVar22._0_4_ + auVar2._0_4_;
        auVar20._4_4_ = auVar22._4_4_ + auVar2._4_4_;
        auVar20._8_4_ = auVar22._8_4_ + auVar2._8_4_;
        auVar20._12_4_ = auVar22._12_4_ + auVar2._12_4_;
        auVar2 = vhaddps_avx(auVar20,auVar20);
        *(int *)(lVar4 + lVar13 * lVar8 * 4 + lVar1 * 4 + lVar14 * 4) = auVar2._0_4_;
        lVar14 = 1;
        pfVar15 = local_a0;
        bVar9 = false;
      } while (bVar11);
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar10);
  }
  return;
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }